

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour_correspondence.hpp
# Opt level: O2

ModelContour *
eos::fitting::ModelContour::load(ModelContour *__return_storage_ptr__,string *filename)

{
  runtime_error *this;
  JSONInputArchive input_archive;
  ifstream file;
  byte abStack_208 [488];
  
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->left_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->right_contour).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(&file,(string *)filename,_S_in);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    cereal::JSONInputArchive::JSONInputArchive(&input_archive,(istream *)&file);
    cereal::InputArchive<cereal::JSONInputArchive,0u>::operator()
              ((InputArchive<cereal::JSONInputArchive,0u> *)&input_archive,__return_storage_ptr__);
    cereal::JSONInputArchive::~JSONInputArchive(&input_archive);
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_archive
                 ,"Error opening given file: ",filename);
  std::runtime_error::runtime_error(this,(string *)&input_archive);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static ModelContour load(std::string filename)
    {
        ModelContour contour;

        std::ifstream file(filename);
        if (!file)
        {
            throw std::runtime_error("Error opening given file: " + filename);
        }
        cereal::JSONInputArchive input_archive(file);
        input_archive(contour);

        return contour;
    }